

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

ESemantic Assimp::PLY::Property::ParseSemantic(vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  Logger *this;
  ESemantic local_14;
  ESemantic eOut;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_14 = EST_INVALID;
    bVar1 = DOM::TokenMatch(buffer,"red",3);
    if (bVar1) {
      local_14 = EST_Red;
    }
    else {
      bVar1 = DOM::TokenMatch(buffer,"green",5);
      if (bVar1) {
        local_14 = EST_Green;
      }
      else {
        bVar1 = DOM::TokenMatch(buffer,"blue",4);
        if (bVar1) {
          local_14 = EST_Blue;
        }
        else {
          bVar1 = DOM::TokenMatch(buffer,"alpha",5);
          if (bVar1) {
            local_14 = EST_Alpha;
          }
          else {
            bVar1 = DOM::TokenMatch(buffer,"vertex_index",0xc);
            if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"vertex_indices",0xe), bVar1)) {
              local_14 = EST_VertexIndex;
            }
            else {
              bVar1 = DOM::TokenMatch(buffer,"texcoord",8);
              if (bVar1) {
                local_14 = EST_TextureCoordinates;
              }
              else {
                bVar1 = DOM::TokenMatch(buffer,"material_index",0xe);
                if (bVar1) {
                  local_14 = EST_MaterialIndex;
                }
                else {
                  bVar1 = DOM::TokenMatch(buffer,"ambient_red",0xb);
                  if (bVar1) {
                    local_14 = EST_AmbientRed;
                  }
                  else {
                    bVar1 = DOM::TokenMatch(buffer,"ambient_green",0xd);
                    if (bVar1) {
                      local_14 = EST_AmbientGreen;
                    }
                    else {
                      bVar1 = DOM::TokenMatch(buffer,"ambient_blue",0xc);
                      if (bVar1) {
                        local_14 = EST_AmbientBlue;
                      }
                      else {
                        bVar1 = DOM::TokenMatch(buffer,"ambient_alpha",0xd);
                        if (bVar1) {
                          local_14 = EST_AmbientAlpha;
                        }
                        else {
                          bVar1 = DOM::TokenMatch(buffer,"diffuse_red",0xb);
                          if (bVar1) {
                            local_14 = EST_DiffuseRed;
                          }
                          else {
                            bVar1 = DOM::TokenMatch(buffer,"diffuse_green",0xd);
                            if (bVar1) {
                              local_14 = EST_DiffuseGreen;
                            }
                            else {
                              bVar1 = DOM::TokenMatch(buffer,"diffuse_blue",0xc);
                              if (bVar1) {
                                local_14 = EST_DiffuseBlue;
                              }
                              else {
                                bVar1 = DOM::TokenMatch(buffer,"diffuse_alpha",0xd);
                                if (bVar1) {
                                  local_14 = EST_DiffuseAlpha;
                                }
                                else {
                                  bVar1 = DOM::TokenMatch(buffer,"specular_red",0xc);
                                  if (bVar1) {
                                    local_14 = EST_SpecularRed;
                                  }
                                  else {
                                    bVar1 = DOM::TokenMatch(buffer,"specular_green",0xe);
                                    if (bVar1) {
                                      local_14 = EST_SpecularGreen;
                                    }
                                    else {
                                      bVar1 = DOM::TokenMatch(buffer,"specular_blue",0xd);
                                      if (bVar1) {
                                        local_14 = EST_SpecularBlue;
                                      }
                                      else {
                                        bVar1 = DOM::TokenMatch(buffer,"specular_alpha",0xe);
                                        if (bVar1) {
                                          local_14 = EST_SpecularAlpha;
                                        }
                                        else {
                                          bVar1 = DOM::TokenMatch(buffer,"opacity",7);
                                          if (bVar1) {
                                            local_14 = EST_Opacity;
                                          }
                                          else {
                                            bVar1 = DOM::TokenMatch(buffer,"specular_power",0xe);
                                            if (bVar1) {
                                              local_14 = EST_PhongPower;
                                            }
                                            else {
                                              bVar1 = DOM::TokenMatch(buffer,"r",1);
                                              if (bVar1) {
                                                local_14 = EST_Red;
                                              }
                                              else {
                                                bVar1 = DOM::TokenMatch(buffer,"g",1);
                                                if (bVar1) {
                                                  local_14 = EST_Green;
                                                }
                                                else {
                                                  bVar1 = DOM::TokenMatch(buffer,"b",1);
                                                  if (bVar1) {
                                                    local_14 = EST_Blue;
                                                  }
                                                  else {
                                                    bVar1 = DOM::TokenMatch(buffer,"u",1);
                                                    if ((((bVar1) ||
                                                         (bVar1 = DOM::TokenMatch(buffer,"s",1),
                                                         bVar1)) ||
                                                        (bVar1 = DOM::TokenMatch(buffer,"tx",2),
                                                        bVar1)) ||
                                                       (bVar1 = DOM::TokenMatch(buffer,"texture_u",9
                                                                               ), bVar1)) {
                                                      local_14 = EST_UTextureCoord;
                                                    }
                                                    else {
                                                      bVar1 = DOM::TokenMatch(buffer,"v",1);
                                                      if (((bVar1) ||
                                                          (bVar1 = DOM::TokenMatch(buffer,"t",1),
                                                          bVar1)) ||
                                                         ((bVar1 = DOM::TokenMatch(buffer,"ty",2),
                                                          bVar1 || (bVar1 = DOM::TokenMatch(buffer,
                                                  "texture_v",9), bVar1)))) {
                                                    local_14 = EST_VTextureCoord;
                                                  }
                                                  else {
                                                    bVar1 = DOM::TokenMatch(buffer,"x",1);
                                                    if (bVar1) {
                                                      local_14 = EST_XCoord;
                                                    }
                                                    else {
                                                      bVar1 = DOM::TokenMatch(buffer,"y",1);
                                                      if (bVar1) {
                                                        local_14 = EST_YCoord;
                                                      }
                                                      else {
                                                        bVar1 = DOM::TokenMatch(buffer,"z",1);
                                                        if (bVar1) {
                                                          local_14 = EST_ZCoord;
                                                        }
                                                        else {
                                                          bVar1 = DOM::TokenMatch(buffer,"nx",2);
                                                          if (bVar1) {
                                                            local_14 = EST_XNormal;
                                                          }
                                                          else {
                                                            bVar1 = DOM::TokenMatch(buffer,"ny",2);
                                                            if (bVar1) {
                                                              local_14 = EST_YNormal;
                                                            }
                                                            else {
                                                              bVar1 = DOM::TokenMatch(buffer,"nz",2)
                                                              ;
                                                              if (bVar1) {
                                                                local_14 = EST_ZNormal;
                                                              }
                                                              else {
                                                                this = DefaultLogger::get();
                                                                Logger::info(this,
                                                  "Found unknown property semantic in file. This is ok"
                                                  );
                                                  DOM::SkipLine(buffer);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return local_14;
  }
  __assert_fail("!buffer.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x6c,
                "static PLY::ESemantic Assimp::PLY::Property::ParseSemantic(std::vector<char> &)");
}

Assistant:

PLY::ESemantic PLY::Property::ParseSemantic(std::vector<char> &buffer) {
  ai_assert(!buffer.empty());

  PLY::ESemantic eOut = PLY::EST_INVALID;
  if (PLY::DOM::TokenMatch(buffer, "red", 3)) {
    eOut = PLY::EST_Red;
  }
  else if (PLY::DOM::TokenMatch(buffer, "green", 5)) {
    eOut = PLY::EST_Green;
  }
  else if (PLY::DOM::TokenMatch(buffer, "blue", 4)) {
    eOut = PLY::EST_Blue;
  }
  else if (PLY::DOM::TokenMatch(buffer, "alpha", 5)) {
    eOut = PLY::EST_Alpha;
  }
  else if (PLY::DOM::TokenMatch(buffer, "vertex_index", 12) || PLY::DOM::TokenMatch(buffer, "vertex_indices", 14)) {
    eOut = PLY::EST_VertexIndex;
  }
  else if (PLY::DOM::TokenMatch(buffer, "texcoord", 8)) // Manage uv coords on faces
  {
    eOut = PLY::EST_TextureCoordinates;
  }
  else if (PLY::DOM::TokenMatch(buffer, "material_index", 14))
  {
    eOut = PLY::EST_MaterialIndex;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ambient_red", 11))
  {
    eOut = PLY::EST_AmbientRed;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ambient_green", 13))
  {
    eOut = PLY::EST_AmbientGreen;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ambient_blue", 12))
  {
    eOut = PLY::EST_AmbientBlue;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ambient_alpha", 13))
  {
    eOut = PLY::EST_AmbientAlpha;
  }
  else if (PLY::DOM::TokenMatch(buffer, "diffuse_red", 11))
  {
    eOut = PLY::EST_DiffuseRed;
  }
  else if (PLY::DOM::TokenMatch(buffer, "diffuse_green", 13))
  {
    eOut = PLY::EST_DiffuseGreen;
  }
  else if (PLY::DOM::TokenMatch(buffer, "diffuse_blue", 12))
  {
    eOut = PLY::EST_DiffuseBlue;
  }
  else if (PLY::DOM::TokenMatch(buffer, "diffuse_alpha", 13))
  {
    eOut = PLY::EST_DiffuseAlpha;
  }
  else if (PLY::DOM::TokenMatch(buffer, "specular_red", 12))
  {
    eOut = PLY::EST_SpecularRed;
  }
  else if (PLY::DOM::TokenMatch(buffer, "specular_green", 14))
  {
    eOut = PLY::EST_SpecularGreen;
  }
  else if (PLY::DOM::TokenMatch(buffer, "specular_blue", 13))
  {
    eOut = PLY::EST_SpecularBlue;
  }
  else if (PLY::DOM::TokenMatch(buffer, "specular_alpha", 14))
  {
    eOut = PLY::EST_SpecularAlpha;
  }
  else if (PLY::DOM::TokenMatch(buffer, "opacity", 7))
  {
    eOut = PLY::EST_Opacity;
  }
  else if (PLY::DOM::TokenMatch(buffer, "specular_power", 14))
  {
    eOut = PLY::EST_PhongPower;
  }
  else if (PLY::DOM::TokenMatch(buffer, "r", 1))
  {
    eOut = PLY::EST_Red;
  }
  else if (PLY::DOM::TokenMatch(buffer, "g", 1))
  {
    eOut = PLY::EST_Green;
  }
  else if (PLY::DOM::TokenMatch(buffer, "b", 1))
  {
    eOut = PLY::EST_Blue;
  }

  // NOTE: Blender3D exports texture coordinates as s,t tuples
  else if (PLY::DOM::TokenMatch(buffer, "u", 1) || PLY::DOM::TokenMatch(buffer, "s", 1) || PLY::DOM::TokenMatch(buffer, "tx", 2) || PLY::DOM::TokenMatch(buffer, "texture_u", 9))
  {
    eOut = PLY::EST_UTextureCoord;
  }
  else if (PLY::DOM::TokenMatch(buffer, "v", 1) || PLY::DOM::TokenMatch(buffer, "t", 1) || PLY::DOM::TokenMatch(buffer, "ty", 2) || PLY::DOM::TokenMatch(buffer, "texture_v", 9))
  {
    eOut = PLY::EST_VTextureCoord;
  }
  else if (PLY::DOM::TokenMatch(buffer, "x", 1))
  {
    eOut = PLY::EST_XCoord;
  }
  else if (PLY::DOM::TokenMatch(buffer, "y", 1)) {
    eOut = PLY::EST_YCoord;
  }
  else if (PLY::DOM::TokenMatch(buffer, "z", 1)) {
    eOut = PLY::EST_ZCoord;
  }
  else if (PLY::DOM::TokenMatch(buffer, "nx", 2)) {
    eOut = PLY::EST_XNormal;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ny", 2)) {
    eOut = PLY::EST_YNormal;
  }
  else if (PLY::DOM::TokenMatch(buffer, "nz", 2)) {
    eOut = PLY::EST_ZNormal;
  }
  else {
      ASSIMP_LOG_INFO("Found unknown property semantic in file. This is ok");
    PLY::DOM::SkipLine(buffer);
  }
  return eOut;
}